

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSharedPtr.hpp
# Opt level: O0

void __thiscall
de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::SharedPtr
          (SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *this,Texture *ptr)

{
  Texture *pTVar1;
  SharedPtrState<deqp::egl::GLES2ThreadTest::Texture,_de::DefaultDeleter<deqp::egl::GLES2ThreadTest::Texture>_>
  *pSVar2;
  DefaultDeleter<deqp::egl::GLES2ThreadTest::Texture> local_25 [13];
  Texture *local_18;
  Texture *ptr_local;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *this_local;
  
  this->m_ptr = (Texture *)0x0;
  this->m_state = (SharedPtrStateBase *)0x0;
  this->m_ptr = ptr;
  local_18 = ptr;
  ptr_local = (Texture *)this;
  pSVar2 = (SharedPtrState<deqp::egl::GLES2ThreadTest::Texture,_de::DefaultDeleter<deqp::egl::GLES2ThreadTest::Texture>_>
            *)operator_new(0x20);
  pTVar1 = local_18;
  DefaultDeleter<deqp::egl::GLES2ThreadTest::Texture>::DefaultDeleter(local_25);
  SharedPtrState<deqp::egl::GLES2ThreadTest::Texture,_de::DefaultDeleter<deqp::egl::GLES2ThreadTest::Texture>_>
  ::SharedPtrState(pSVar2,pTVar1);
  this->m_state = (SharedPtrStateBase *)pSVar2;
  this->m_state->strongRefCount = 1;
  this->m_state->weakRefCount = 1;
  return;
}

Assistant:

inline SharedPtr<T>::SharedPtr (T* ptr)
	: m_ptr		(DE_NULL)
	, m_state	(DE_NULL)
{
	try
	{
		m_ptr	= ptr;
		m_state	= new SharedPtrState<T, DefaultDeleter<T> >(ptr, DefaultDeleter<T>());
		m_state->strongRefCount	= 1;
		m_state->weakRefCount	= 1;
	}
	catch (...)
	{
		// \note ptr is not released.
		delete m_state;
		throw;
	}
}